

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

MOJOSHADER_sampler * build_samplers(Context *ctx)

{
  MOJOSHADER_samplerType MVar1;
  size_t len_00;
  MOJOSHADER_sampler *__s;
  char *pcVar2;
  int local_2c;
  RegisterList *pRStack_28;
  int i;
  RegisterList *item;
  MOJOSHADER_sampler *retval;
  size_t len;
  Context *ctx_local;
  
  len_00 = (long)ctx->sampler_count * 0x18;
  __s = (MOJOSHADER_sampler *)Malloc(ctx,len_00);
  if (__s != (MOJOSHADER_sampler *)0x0) {
    pRStack_28 = (ctx->samplers).next;
    memset(__s,0,len_00);
    for (local_2c = 0; local_2c < ctx->sampler_count; local_2c = local_2c + 1) {
      if (pRStack_28 == (RegisterList *)0x0) {
        fail(ctx,"BUG: mismatched sampler list and count");
        return __s;
      }
      if (pRStack_28->regtype != REG_TYPE_SAMPLER) {
        __assert_fail("item->regtype == REG_TYPE_SAMPLER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x2cce,"MOJOSHADER_sampler *build_samplers(Context *)");
      }
      MVar1 = cvtD3DToMojoSamplerType(pRStack_28->index);
      __s[local_2c].type = MVar1;
      __s[local_2c].index = pRStack_28->regnum;
      pcVar2 = alloc_varname(ctx,pRStack_28);
      __s[local_2c].name = pcVar2;
      __s[local_2c].texbem = (uint)(pRStack_28->misc != 0);
      pRStack_28 = pRStack_28->next;
    }
  }
  return __s;
}

Assistant:

static MOJOSHADER_sampler *build_samplers(Context *ctx)
{
    const size_t len = sizeof (MOJOSHADER_sampler) * ctx->sampler_count;
    MOJOSHADER_sampler *retval = (MOJOSHADER_sampler *) Malloc(ctx, len);

    if (retval != NULL)
    {
        RegisterList *item = ctx->samplers.next;
        int i;

        memset(retval, '\0', len);

        for (i = 0; i < ctx->sampler_count; i++)
        {
            if (item == NULL)
            {
                fail(ctx, "BUG: mismatched sampler list and count");
                break;
            } // if

            assert(item->regtype == REG_TYPE_SAMPLER);
            retval[i].type = cvtD3DToMojoSamplerType((TextureType) item->index);
            retval[i].index = item->regnum;
            retval[i].name = alloc_varname(ctx, item);
            retval[i].texbem = (item->misc != 0) ? 1 : 0;
            item = item->next;
        } // for
    } // if

    return retval;
}